

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

double labpack_read_double(labpack_reader_t *reader)

{
  _Bool _Var1;
  double local_18;
  double value;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0x118,"double labpack_read_double(labpack_reader_t *)");
  }
  local_18 = 0.0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_18 = mpack_expect_double(reader->decoder);
    labpack_reader_check_decoder(reader);
  }
  return local_18;
}

Assistant:

double
labpack_read_double(labpack_reader_t* reader)
{
    assert(reader);
    double value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_double(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}